

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_4,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  undefined4 uVar8;
  undefined8 local_80;
  Type in1;
  Vector<float,_3> res_1;
  Matrix<float,_2,_4> retVal;
  undefined8 uStack_38;
  Matrix<float,_4,_2> res;
  Type in0;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    res.m_data.m_data[1].m_data[2] = (evalCtx->coords).m_data[0];
    res.m_data.m_data[1].m_data[3] = (evalCtx->coords).m_data[1];
  }
  else {
    res.m_data.m_data[1].m_data[2] = 1.4;
    res.m_data.m_data[1].m_data[3] = 0.2;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_80 = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_80 = 0x3f8000003f000000;
  }
  pfVar1 = res_1.m_data + 2;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  stack0xffffffffffffff98 = (Vec4 *)0x0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      fVar7 = 1.0;
      if (lVar3 != lVar4) {
        fVar7 = 0.0;
      }
      pfVar1[lVar4 * 2] = fVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pfVar1 = pfVar1 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  pfVar1 = res_1.m_data + 2;
  lVar3 = 0;
  do {
    fVar7 = (&in1)[-1].m_data[lVar3];
    lVar4 = 0;
    do {
      pfVar1[lVar4 * 2] = in0.m_data[lVar4 + -2] * fVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pfVar1 = pfVar1 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  puVar2 = &uStack_38;
  res.m_data.m_data[0].m_data[2] = 0.0;
  res.m_data.m_data[0].m_data[3] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  uStack_38 = 0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar3 != lVar5) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)puVar2 + lVar5) = uVar8;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 == 0x10);
    lVar4 = lVar4 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    lVar3 = lVar3 + 0x10;
  } while (lVar4 != 4);
  puVar2 = &uStack_38;
  pfVar1 = res_1.m_data + 2;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(float *)((long)puVar2 + lVar4 * 4) = pfVar1[lVar4 * 2];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    puVar2 = puVar2 + 2;
    pfVar1 = pfVar1 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  stack0xffffffffffffff98 = (Vec4 *)uStack_38;
  retVal.m_data.m_data[0].m_data[0] = res.m_data.m_data[0].m_data[0];
  stack0xffffffffffffffbc = CONCAT44(res.m_data.m_data[1].m_data[0],res.m_data.m_data[0].m_data[3]);
  in1.m_data[0] = 0.0;
  in1.m_data[1] = 0.0;
  res_1.m_data[0] = 0.0;
  lVar3 = 0;
  do {
    in1.m_data[lVar3] = res_1.m_data[lVar3 + 2] + retVal.m_data.m_data[3].m_data[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  stack0xffffffffffffff98 = &evalCtx->color;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 1.4013e-45;
  retVal.m_data.m_data[1].m_data[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)res_1.m_data[lVar3 + 2]] = (&in1)[-1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}